

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O2

CURLcode get_url_file_name(GlobalConfig *global,char **filename,char *url)

{
  char *pcVar1;
  char **ppcVar2;
  CURLUcode ucode;
  CURLcode CVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  char *path;
  char **local_40;
  GlobalConfig *local_38;
  
  lVar4 = curl_url();
  path = (char *)0x0;
  if (lVar4 == 0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *filename = (char *)0x0;
    ucode = curl_url_set(lVar4,0,url);
    if (ucode == CURLUE_OK) {
      ucode = curl_url_get(lVar4,7,&path);
      curl_url_cleanup(lVar4);
      if (ucode == CURLUE_OK) {
        pcVar6 = (char *)0x0;
        local_40 = filename;
        local_38 = global;
        iVar8 = 2;
        while (iVar7 = iVar8, pcVar1 = path, iVar8 = iVar7 + -1, iVar7 != 0) {
          pcVar5 = strrchr(path,0x2f);
          pcVar6 = pcVar5 + 1;
          if (pcVar5 == (char *)0x0) {
            pcVar6 = pcVar1;
          }
          pcVar6 = strrchr(pcVar6,0x5c);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = pcVar5;
          }
          if (((pcVar6 != (char *)0x0) && (iVar7 == 2)) && (pcVar6[1] == '\0')) {
            *pcVar6 = '\0';
          }
        }
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "curl_response";
          warnf(local_38,"No remote file name, uses \"%s\"","curl_response");
        }
        else {
          pcVar6 = pcVar6 + 1;
        }
        ppcVar2 = local_40;
        pcVar6 = strdup(pcVar6);
        *ppcVar2 = pcVar6;
        curl_free(path);
        if (*ppcVar2 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        return CURLE_OK;
      }
      lVar4 = 0;
    }
    curl_url_cleanup(lVar4);
    CVar3 = urlerr_cvt(ucode);
  }
  return CVar3;
}

Assistant:

CURLcode get_url_file_name(struct GlobalConfig *global,
                           char **filename, const char *url)
{
  CURLU *uh = curl_url();
  char *path = NULL;
  CURLUcode uerr;

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  *filename = NULL;

  uerr = curl_url_set(uh, CURLUPART_URL, url, CURLU_GUESS_SCHEME);
  if(!uerr) {
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    curl_url_cleanup(uh);
    uh = NULL;
    if(!uerr) {
      int i;
      char *pc = NULL, *pc2 = NULL;
      for(i = 0; i < 2; i++) {
        pc = strrchr(path, '/');
        pc2 = strrchr(pc ? pc + 1 : path, '\\');
        if(pc2)
          pc = pc2;
        if(pc && !pc[1] && !i) {
          /* if the path ends with slash, try removing the trailing one
             and get the last directory part */
          *pc = 0;
        }
      }

      if(pc)
        /* duplicate the string beyond the slash */
        pc++;
      else {
        /* no slash => empty string, use default */
        pc = (char *)"curl_response";
        warnf(global, "No remote file name, uses \"%s\"", pc);
      }

      *filename = strdup(pc);
      curl_free(path);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
      {
        char *sanitized;
        SANITIZEcode sc = sanitize_file_name(&sanitized, *filename, 0);
        Curl_safefree(*filename);
        if(sc) {
          if(sc == SANITIZE_ERR_OUT_OF_MEMORY)
            return CURLE_OUT_OF_MEMORY;
          return CURLE_URL_MALFORMAT;
        }
        *filename = sanitized;
      }
#endif /* _WIN32 || MSDOS */

      /* in case we built debug enabled, we allow an environment variable
       * named CURL_TESTDIR to prefix the given filename to put it into a
       * specific directory
       */
#ifdef DEBUGBUILD
      {
        char *tdir = curl_getenv("CURL_TESTDIR");
        if(tdir) {
          char *alt = aprintf("%s/%s", tdir, *filename);
          Curl_safefree(*filename);
          *filename = alt;
          curl_free(tdir);
          if(!*filename)
            return CURLE_OUT_OF_MEMORY;
        }
      }
#endif
      return CURLE_OK;
    }
  }
  curl_url_cleanup(uh);
  return urlerr_cvt(uerr);
}